

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O3

void __thiscall QColumnViewPrivate::setPreviewWidget(QColumnViewPrivate *this,QWidget *widget)

{
  Data *pDVar1;
  QWidgetData *pQVar2;
  QWidget *this_00;
  QSize QVar3;
  QScrollBar *pQVar4;
  QWidget *pQVar5;
  long lVar6;
  Representation w;
  
  pQVar5 = *(QWidget **)
            &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
             super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  if (this->previewColumn != (QAbstractItemView *)0x0) {
    lVar6 = (this->columns).d.size;
    if ((lVar6 != 0) && ((this->columns).d.ptr[lVar6 + -1] == this->previewColumn)) {
      pDVar1 = (this->columns).d.d;
      if ((pDVar1 == (Data *)0x0) ||
         (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QArrayDataPointer<QAbstractItemView_*>::reallocateAndGrow
                  (&(this->columns).d,GrowsAtEnd,0,(QArrayDataPointer<QAbstractItemView_*> *)0x0);
        lVar6 = (this->columns).d.size;
      }
      (this->columns).d.size = lVar6 + -1;
    }
    QObject::deleteLater();
  }
  this_00 = (QWidget *)operator_new(0x30);
  QAbstractItemView::QAbstractItemView((QAbstractItemView *)this_00,pQVar5);
  *(undefined ***)this_00 = &PTR_metaObject_0080d188;
  *(undefined ***)&this_00->super_QPaintDevice = &PTR__QColumnViewPreviewColumn_0080d498;
  *(QWidget **)(this_00 + 1) = widget;
  QVar3 = QWidget::minimumSize(widget);
  QWidget::setMinimumWidth(this_00,QVar3.wd.m_i.m_i);
  this->previewColumn = (QAbstractItemView *)this_00;
  QWidget::hide(this_00);
  QFrame::setFrameShape((QFrame *)this->previewColumn,NoFrame);
  QAbstractScrollArea::setVerticalScrollBarPolicy
            ((QAbstractScrollArea *)this->previewColumn,ScrollBarAlwaysOn);
  QAbstractItemView::setSelectionMode((QAbstractItemView *)this->previewColumn,NoSelection);
  pQVar5 = (QWidget *)this->previewColumn;
  pQVar4 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)pQVar5);
  pQVar2 = (pQVar4->super_QAbstractSlider).super_QWidget.data;
  w.m_i = ((pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i) + 1;
  QVar3 = QWidget::minimumSize((QWidget *)this->previewColumn);
  if (w.m_i <= QVar3.wd.m_i.m_i) {
    w.m_i = QVar3.wd.m_i.m_i;
  }
  QWidget::setMinimumWidth(pQVar5,w.m_i);
  this->previewWidget = widget;
  pQVar5 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this->previewColumn);
  QWidget::setParent(widget,pQVar5);
  return;
}

Assistant:

void QColumnViewPrivate::setPreviewWidget(QWidget *widget)
{
    Q_Q(QColumnView);
    if (previewColumn) {
        if (!columns.isEmpty() && columns.constLast() == previewColumn)
            columns.removeLast();
        previewColumn->deleteLater();
    }
    QColumnViewPreviewColumn *column = new QColumnViewPreviewColumn(q);
    column->setPreviewWidget(widget);
    previewColumn = column;
    previewColumn->hide();
    previewColumn->setFrameShape(QFrame::NoFrame);
    previewColumn->setVerticalScrollBarPolicy(Qt::ScrollBarAlwaysOn);
    previewColumn->setSelectionMode(QAbstractItemView::NoSelection);
    previewColumn->setMinimumWidth(qMax(previewColumn->verticalScrollBar()->width(),
                previewColumn->minimumWidth()));
    previewWidget = widget;
    previewWidget->setParent(previewColumn->viewport());
}